

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

bool mahjong::is_knitted_straight_wait
               (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *waiting_table)

{
  uint16_t local_b8 [4];
  tile_table_t cnt_table;
  useful_table_t *waiting_table_local;
  intptr_t standing_cnt_local;
  tile_t *standing_tiles_local;
  
  if ((standing_tiles == (tile_t *)0x0) || ((standing_cnt != 0xd && (standing_cnt != 10)))) {
    standing_tiles_local._7_1_ = false;
  }
  else {
    cnt_table._136_8_ = waiting_table;
    map_tiles(standing_tiles,standing_cnt,(tile_table_t *)local_b8);
    standing_tiles_local._7_1_ =
         is_knitted_straight_wait_from_table
                   ((tile_table_t *)local_b8,standing_cnt,(useful_table_t *)cnt_table._136_8_);
  }
  return standing_tiles_local._7_1_;
}

Assistant:

bool is_knitted_straight_wait(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *waiting_table) {
    if (standing_tiles == nullptr || (standing_cnt != 13 && standing_cnt != 10)) {
        return false;
    }

    // 对立牌的种类进行打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    return is_knitted_straight_wait_from_table(cnt_table, standing_cnt, waiting_table);
}